

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-oob.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  ssize_t *psVar2;
  int64_t eval_b;
  int64_t eval_a;
  ssize_t local_18;
  
  if (tcp != (uv_stream_t *)0x0) {
    if (nread < 0) {
      local_18 = nread;
      if (nread != -0xfff) goto LAB_001d1c11;
      puts("GOT EOF");
      uv_close(tcp,close_cb);
    }
    else {
      bytes_received_done = bytes_received_done + nread;
    }
    free(buf->base);
    return;
  }
  read_cb_cold_2();
LAB_001d1c11:
  psVar2 = &local_18;
  read_cb_cold_1();
  if (psVar2 != (ssize_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(psVar2,0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf) {
#ifdef __MVS__
  char lbuf[12];
#endif
  uv_os_fd_t fd;

  ASSERT_GE(nread, 0);
  ASSERT_OK(uv_fileno((uv_handle_t*)handle, &fd));
  ASSERT_OK(uv_idle_start(&idle, idle_cb));

#ifdef __MVS__
  /* Need to flush out the OOB data. Otherwise, this callback will get
   * triggered on every poll with nread = 0.
   */
  ASSERT_NE(-1, recv(fd, lbuf, sizeof(lbuf), MSG_OOB));
#endif
}